

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O1

void gen_rim_i64(TCGContext_conflict12 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b,int64_t c)

{
  TCGTemp *ts;
  uintptr_t o;
  uintptr_t o_1;
  
  ts = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_rotli_i64_s390x(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),a,(uint)c & 0x3f);
  tcg_gen_op3_s390x(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts,(TCGArg)ts,
                    (TCGArg)(b + (long)&tcg_ctx->pool_cur));
  tcg_gen_andc_i64_s390x(tcg_ctx,d,d,b);
  tcg_gen_op3_s390x(tcg_ctx,INDEX_op_or_i64,(TCGArg)(d + (long)tcg_ctx),(TCGArg)(d + (long)tcg_ctx),
                    (TCGArg)ts);
  tcg_temp_free_internal_s390x(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_rim_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b, int64_t c)
{
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_rotli_i64(tcg_ctx, t, a, c & 63);
    tcg_gen_and_i64(tcg_ctx, t, t, b);
    tcg_gen_andc_i64(tcg_ctx, d, d, b);
    tcg_gen_or_i64(tcg_ctx, d, d, t);

    tcg_temp_free_i64(tcg_ctx, t);
}